

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O0

void __thiscall
Disa::Vector_Dense<double,_3UL>::Vector_Dense
          (Vector_Dense<double,_3UL> *this,function<double_(unsigned_long)> *lambda,size_t size)

{
  ostream *poVar1;
  size_type sVar2;
  reference pvVar3;
  source_location *in_RCX;
  double dVar4;
  ulong local_60;
  size_type i_element;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_t local_20;
  size_t size_local;
  function<double_(unsigned_long)> *lambda_local;
  Vector_Dense<double,_3UL> *this_local;
  
  size_local = (size_t)lambda;
  lambda_local = (function<double_(unsigned_long)> *)this;
  if (size != 3) {
    local_20 = size;
    poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
    local_48 = &PTR_s__workspace_llm4binary_github_lic_001b5588;
    console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,in_RCX);
    poVar1 = std::operator<<(poVar1,(string *)&local_40);
    poVar1 = std::operator<<(poVar1,"Cannot change the size for a static vector.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_40);
    exit(1);
  }
  local_60 = 0;
  local_20 = 3;
  while( true ) {
    sVar2 = std::array<double,_3UL>::size(&this->super_array<double,_3UL>);
    if (sVar2 <= local_60) break;
    dVar4 = std::function<double_(unsigned_long)>::operator()
                      ((function<double_(unsigned_long)> *)size_local,local_60);
    pvVar3 = std::array<double,_3UL>::operator[](&this->super_array<double,_3UL>,local_60);
    *pvVar3 = dVar4;
    local_60 = local_60 + 1;
  }
  return;
}

Assistant:

explicit Vector_Dense(const std::function<_type(const std::size_t)>& lambda, std::size_t size = _size) {
    ASSERT_DEBUG(size == _size, "Cannot change the size for a static vector.");
    FOR(i_element, this->size())(*this)[i_element] = lambda(i_element);
  }